

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

bool __thiscall
ProjectBuilderMakefileGenerator::replaceLibrarySuffix
          (ProjectBuilderMakefileGenerator *this,QString *lib_file,ProString *opt,QString *name,
          QString *library)

{
  QString *pQVar1;
  QMakeProject *pQVar2;
  char16_t *pcVar3;
  QString file;
  bool bVar4;
  char cVar5;
  qsizetype qVar6;
  QString *pQVar7;
  SourceFiles *pSVar8;
  long in_FS_OFFSET;
  Data *in_stack_fffffffffffffed8;
  QArrayDataPointer<char16_t> *pQVar9;
  char16_t *pcStack_120;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString> local_f8;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_70;
  ProString local_68;
  QHash<QString,_QList<QString>_> local_38;
  
  local_38.d = *(Data **)(in_FS_OFFSET + 0x28);
  if ((lib_file->d).size == 0) {
    bVar4 = false;
    goto LAB_0012bdce;
  }
  local_70.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
          *)0x0;
  bVar4 = QMakeMetaInfo::readLib((QMakeMetaInfo *)&local_70,lib_file);
  if (bVar4) {
    ProKey::ProKey((ProKey *)&local_f8,"QMAKE_PRL_TARGET");
    bVar4 = QMakeMetaInfo::isEmpty((QMakeMetaInfo *)&local_70,(ProKey *)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    if (bVar4) goto LAB_0012b913;
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_a0.d = (lib_file->d).d;
    local_a0.ptr = (lib_file->d).ptr;
    local_a0.size = (lib_file->d).size;
    if (local_a0.d != (Data *)0x0) {
      LOCK();
      ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file.d.ptr = (char16_t *)name;
    file.d.d = (Data *)library;
    file.d.size = (qsizetype)in_stack_fffffffffffffed8;
    MakefileGenerator::fileInfo((MakefileGenerator *)&local_f8,file);
    QFileInfo::absolutePath();
    QFileInfo::~QFileInfo((QFileInfo *)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    ProKey::ProKey((ProKey *)&stack0xfffffffffffffed8,"QMAKE_PRL_TARGET");
    QMakeMetaInfo::first(&local_68,(QMakeMetaInfo *)&local_70,(ProKey *)&stack0xfffffffffffffed8);
    local_f8.a.a = (QString *)&local_88;
    local_f8.a.b = &Option::dir_sep;
    ProString::ProString(&local_f8.b,&local_68);
    QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString>::convertTo<QString>
              ((QString *)&local_b8,&local_f8);
    pQVar7 = (QString *)(library->d).d;
    pcVar3 = (library->d).ptr;
    (library->d).d = local_b8.d;
    (library->d).ptr = local_b8.ptr;
    pQVar1 = (QString *)(library->d).size;
    (library->d).size = local_b8.size;
    local_b8.d = (Data *)pQVar7;
    local_b8.ptr = pcVar3;
    local_b8.size = (qsizetype)pQVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8.b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
    if (Option::debug_level != 0) {
      ProString::toLatin1((QByteArray *)&local_f8,opt);
      pSVar8 = (SourceFiles *)local_f8.a.b;
      if ((SourceFiles *)local_f8.a.b == (SourceFiles *)0x0) {
        pSVar8 = (SourceFiles *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_68);
      pQVar7 = (QString *)local_68.m_string.d.ptr;
      if ((QString *)local_68.m_string.d.ptr == (QString *)0x0) {
        pQVar7 = (QString *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&stack0xfffffffffffffed8);
      if (pcStack_120 == (char16_t *)0x0) {
        pcStack_120 = (char16_t *)&QByteArray::_empty;
      }
      debug_msg_internal(1,"pbuilder: Found library (%s) via PRL %s (%s)",pSVar8,pQVar7,pcStack_120)
      ;
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&stack0xfffffffffffffed8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
    }
    pQVar2 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)&local_f8,"xcode_dynamic_library_suffix");
    bVar4 = QMakeProject::isActiveConfig(pQVar2,(QString *)&local_f8,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    if (bVar4) {
      pQVar9 = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
      pQVar2 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_XCODE_LIBRARY_SUFFIX_SETTING");
      QMakeEvaluator::first
                ((ProString *)&local_f8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_68);
      ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      local_b8.size = -0x5555555555555556;
      local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar2 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_XCODE_LIBRARY_SUFFIX");
      QMakeEvaluator::first
                ((ProString *)&local_f8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_68);
      ProString::toQString((QString *)&local_b8,(ProString *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      local_68.m_string.d.d = (Data *)0x21866a;
      local_68.m_string.d.size = 0x21cb0b;
      local_68.m_string.d.ptr = (char16_t *)&stack0xfffffffffffffed8;
      QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>::
      convertTo<QString>((QString *)&local_f8,
                         (QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>
                          *)&local_68);
      local_f8.a.b = (QString *)0xaaaaaaaaaaaaaaaa;
      local_f8.b.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_f8.a.a = (QString *)pQVar9;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      if ((QString *)local_b8.size == (QString *)0x0) {
        qVar6 = QString::lastIndexOf(library,name,CaseSensitive);
        if ((int)qVar6 != -1) {
          QString::insert(library,(long)(int)qVar6 + (name->d).size,
                          (QString *)&stack0xfffffffffffffed8);
        }
      }
      else {
        local_68.m_string.d.ptr = (char16_t *)CONCAT71(local_68.m_string.d.ptr._1_7_,0x2e);
        local_68.m_string.d.d = (Data *)&local_b8;
        QStringBuilder<QString_&,_char>::convertTo<QString>
                  ((QString *)&local_f8,(QStringBuilder<QString_&,_char> *)&local_68);
        qVar6 = QString::lastIndexOf(library,(QString *)&local_f8,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        if ((int)qVar6 == -1) {
          QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_b8);
          pSVar8 = (SourceFiles *)local_f8.a.b;
          if ((SourceFiles *)local_f8.a.b == (SourceFiles *)0x0) {
            pSVar8 = (SourceFiles *)&QByteArray::_empty;
          }
          QString::toLocal8Bit((QByteArray *)&local_68,library);
          pQVar7 = (QString *)local_68.m_string.d.ptr;
          if ((QString *)local_68.m_string.d.ptr == (QString *)0x0) {
            pQVar7 = (QString *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Failed to find expected suffix \'%s\' for library \'%s\'.",pSVar8,
                   pQVar7);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
        }
        else {
          QString::replace((longlong)library,(long)(int)qVar6,(QString *)local_b8.size);
          cVar5 = QString::endsWith((QString *)name,(CaseSensitivity)&local_b8);
          if (cVar5 != '\0') {
            QString::chop((longlong)name);
          }
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    bVar4 = true;
  }
  else {
LAB_0012b913:
    bVar4 = false;
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_70);
LAB_0012bdce:
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38.d) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool ProjectBuilderMakefileGenerator::replaceLibrarySuffix(const QString &lib_file,
                                                           const ProString &opt,
                                                           QString &name, QString &library)
{
    /* This isn't real nice, but it is real useful. This looks in a prl
       for what the library will ultimately be called so we can stick it
       in the ProjectFile. If the prl format ever changes (not likely) then
       this will not really work. However, more concerning is that it will
       encode the version number in the Project file which might be a bad
       things in days to come? --Sam
    */
    if (lib_file.isEmpty())
        return false;

    QMakeMetaInfo libinfo;
    if (!libinfo.readLib(lib_file) || libinfo.isEmpty("QMAKE_PRL_TARGET"))
        return false;

    const QString libDir = fileInfo(lib_file).absolutePath();
    library = libDir + Option::dir_sep + libinfo.first("QMAKE_PRL_TARGET");

    debug_msg(1, "pbuilder: Found library (%s) via PRL %s (%s)",
              opt.toLatin1().constData(), lib_file.toLatin1().constData(), library.toLatin1().constData());

    if (project->isActiveConfig("xcode_dynamic_library_suffix")) {
        QString suffixSetting = project->first("QMAKE_XCODE_LIBRARY_SUFFIX_SETTING").toQString();
        if (!suffixSetting.isEmpty()) {
            QString librarySuffix = project->first("QMAKE_XCODE_LIBRARY_SUFFIX").toQString();
            suffixSetting = "$(" + suffixSetting + ")";
            if (!librarySuffix.isEmpty()) {
                int pos = library.lastIndexOf(librarySuffix + '.');
                if (pos == -1) {
                    warn_msg(WarnLogic, "Failed to find expected suffix '%s' for library '%s'.",
                             qPrintable(librarySuffix), qPrintable(library));
                } else {
                    library.replace(pos, librarySuffix.size(), suffixSetting);
                    if (name.endsWith(librarySuffix))
                        name.chop(librarySuffix.size());
                }
            } else {
                int pos = library.lastIndexOf(name);
                if (pos != -1)
                    library.insert(pos + name.size(), suffixSetting);
            }
        }
    }

    return true;
}